

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int refineBySim2_init(saucy *s,coloring *c)

{
  int *__ptr;
  int iVar1;
  int iVar2;
  Vec_Int_t *randVec;
  saucy_graph *__ptr_00;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t **in_stack_ffffffffffffffc0;
  
  if (0 < NUM_SIM2_ITERATION) {
    iVar2 = 0;
    do {
      randVec = assignRandomBitsToCells(s->pNtk,c);
      __ptr_00 = buildSim2Graph(s->pNtk,c,randVec,s->iDep,(Vec_Int_t **)s->topOrder,
                                (Vec_Ptr_t **)s->obs,s->ctrl,in_stack_ffffffffffffffc0);
      if (__ptr_00 == (saucy_graph *)0x0) {
        __assert_fail("g != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSaucy.c"
                      ,0x562,"int refineBySim2_init(struct saucy *, struct coloring *)");
      }
      in_stack_ffffffffffffffc0 = (Vec_Int_t **)__ptr_00->adj;
      s->adj = (int *)in_stack_ffffffffffffffc0;
      __ptr = __ptr_00->edg;
      s->edg = __ptr;
      iVar5 = s->nsplits;
      if (0 < s->n) {
        iVar1 = 0;
        do {
          if (c->clen[iVar1] == 0) {
            piVar3 = s->sinduce;
            iVar4 = s->nsinduce;
            s->nsinduce = iVar4 + 1;
          }
          else {
            piVar3 = s->ninduce;
            iVar4 = s->nninduce;
            s->nninduce = iVar4 + 1;
          }
          piVar3[iVar4] = iVar1;
          s->indmark[iVar1] = '\x01';
          iVar1 = iVar1 + c->clen[iVar1] + 1;
        } while (iVar1 < s->n);
      }
      refine(s,c);
      if (iVar5 < s->nsplits) {
        if (0 < s->n) {
          iVar2 = 0;
          do {
            if (c->clen[iVar2] == 0) {
              piVar3 = s->sinduce;
              iVar5 = s->nsinduce;
              s->nsinduce = iVar5 + 1;
            }
            else {
              piVar3 = s->ninduce;
              iVar5 = s->nninduce;
              s->nninduce = iVar5 + 1;
            }
            piVar3[iVar5] = iVar2;
            s->indmark[iVar2] = '\x01';
            iVar2 = iVar2 + c->clen[iVar2] + 1;
          } while (iVar2 < s->n);
        }
        s->adj = s->depAdj;
        s->edg = s->depEdg;
        refine(s,c);
        iVar2 = 0;
      }
      if (randVec->pArray != (int *)0x0) {
        free(randVec->pArray);
        randVec->pArray = (int *)0x0;
      }
      if (randVec != (Vec_Int_t *)0x0) {
        free(randVec);
      }
      if (in_stack_ffffffffffffffc0 != (Vec_Int_t **)0x0) {
        free(in_stack_ffffffffffffffc0);
        __ptr_00->adj = (int *)0x0;
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
        __ptr_00->edg = (int *)0x0;
      }
      free(__ptr_00);
      iVar2 = iVar2 + 1;
    } while (iVar2 < NUM_SIM2_ITERATION);
  }
  return 1;
}

Assistant:

static int
refineBySim2_init(struct saucy *s, struct coloring *c) 
{
    struct saucy_graph *g;
    Vec_Int_t * randVec;    
    int i, j;
    int nsplits;    
    
    for (i = 0; i < NUM_SIM2_ITERATION; i++) {
        randVec = assignRandomBitsToCells(s->pNtk, c);      
        g = buildSim2Graph(s->pNtk, c, randVec, s->iDep, s->oDep, s->topOrder, s->obs,  s->ctrl);
        assert(g != NULL);

        s->adj = g->adj;
        s->edg = g->edg;

        nsplits = s->nsplits;
        
        for (j = 0; j < s->n; j += c->clen[j]+1)            
                add_induce(s, c, j);
        refine(s, c);

        if (s->nsplits > nsplits) {                     
            i = 0; /* reset i */
            /* do more refinement by dependency graph */
            for (j = 0; j < s->n; j += c->clen[j]+1)                
                    add_induce(s, c, j);
            refineByDepGraph(s, c);
        }
        
        Vec_IntFree(randVec);
        
        ABC_FREE( g->adj );
        ABC_FREE( g->edg );
        ABC_FREE( g );
    }

    return 1;
}